

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pc-identifiers.c
# Opt level: O3

FUNCTION_RETURN generate_ethernet_pc_id(PcIdentifier *identifiers,uint *num_identifiers,int use_mac)

{
  uchar *puVar1;
  FUNCTION_RETURN FVar2;
  OsAdapterInfo *adapterInfos;
  uchar *puVar3;
  ulong uVar4;
  ulong uVar5;
  uchar uVar6;
  ulong uVar7;
  size_t adapters;
  size_t local_38;
  
  local_38 = 0;
  if ((identifiers == (PcIdentifier *)0x0) || (uVar7 = (ulong)*num_identifiers, uVar7 == 0)) {
    FVar2 = getAdapterInfos((OsAdapterInfo *)0x0,&local_38);
    if ((FVar2 == FUNC_RET_BUFFER_TOO_SMALL) || (FVar2 == FUNC_RET_OK)) {
      *num_identifiers = (uint)local_38;
      FVar2 = FUNC_RET_OK;
    }
  }
  else {
    local_38 = uVar7;
    adapterInfos = (OsAdapterInfo *)malloc(uVar7 * 0x414);
    FVar2 = getAdapterInfos(adapterInfos,&local_38);
    if ((FVar2 == FUNC_RET_BUFFER_TOO_SMALL) || (FVar2 == FUNC_RET_OK)) {
      if (local_38 != 0) {
        puVar3 = adapterInfos->mac_address + 2;
        uVar4 = 0;
        do {
          uVar5 = 0;
          do {
            puVar1 = puVar3;
            if (use_mac == 0) {
              uVar6 = '*';
              if (uVar5 < 4) {
                puVar1 = adapterInfos[uVar4].ipv4_address;
                goto LAB_0020c7f4;
              }
            }
            else {
LAB_0020c7f4:
              uVar6 = puVar1[uVar5];
            }
            (*identifiers)[uVar5] = uVar6;
            uVar5 = uVar5 + 1;
          } while (uVar5 != 6);
          uVar4 = uVar4 + 1;
          identifiers = identifiers + 1;
          puVar3 = puVar3 + 0x414;
        } while ((uVar4 & 0xffffffff) < local_38);
      }
      FVar2 = (uint)(uVar7 < local_38) * 3;
    }
    free(adapterInfos);
  }
  return FVar2;
}

Assistant:

static FUNCTION_RETURN generate_ethernet_pc_id(PcIdentifier * identifiers,
		unsigned int * num_identifiers, int use_mac) {
	FUNCTION_RETURN result_adapterInfos;
	unsigned int j, k;
	OsAdapterInfo *adapterInfos;
	size_t defined_adapters, adapters = 0;

	if (identifiers == NULL || *num_identifiers == 0) {
		result_adapterInfos = getAdapterInfos(NULL, &adapters);
		if (result_adapterInfos == FUNC_RET_OK
				|| result_adapterInfos == FUNC_RET_BUFFER_TOO_SMALL) {
			*num_identifiers = adapters;
			result_adapterInfos = FUNC_RET_OK;
		}
	} else {
		defined_adapters = adapters = *num_identifiers;
		adapterInfos = (OsAdapterInfo*) malloc(
				adapters * sizeof(OsAdapterInfo));
		result_adapterInfos = getAdapterInfos(adapterInfos, &adapters);
		if (result_adapterInfos == FUNC_RET_BUFFER_TOO_SMALL
				|| result_adapterInfos == FUNC_RET_OK) {
			for (j = 0; j < adapters; j++) {
				for (k = 0; k < 6; k++)
					if (use_mac) {
						identifiers[j][k] = adapterInfos[j].mac_address[k + 2];
					} else {
						//use ip
						if (k < 4) {
							identifiers[j][k] = adapterInfos[j].ipv4_address[k];
						} else {
							//padding
							identifiers[j][k] = 42;
						}
					}
			}
			result_adapterInfos = (
					adapters > defined_adapters ?
							FUNC_RET_BUFFER_TOO_SMALL : FUNC_RET_OK);
		}
		free(adapterInfos);
	}
	return result_adapterInfos;
}